

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenIndex BinaryenTryAppendCatchTag(BinaryenExpressionRef expr,char *catchTag)

{
  BinaryenIndex BVar1;
  IString *this;
  undefined1 in_CL;
  string_view sVar2;
  
  if (expr->_id != TryId) {
    __assert_fail("expression->is<Try>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xe86,
                  "BinaryenIndex BinaryenTryAppendCatchTag(BinaryenExpressionRef, const char *)");
  }
  if (catchTag != (char *)0x0) {
    BVar1 = *(BinaryenIndex *)(expr + 3);
    this = (IString *)strlen(catchTag);
    sVar2._M_str = (char *)0x0;
    sVar2._M_len = (size_t)catchTag;
    sVar2 = wasm::IString::interned(this,sVar2,(bool)in_CL);
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)&expr[2].type,(Name)sVar2);
    return BVar1;
  }
  __assert_fail("catchTag",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xe87,
                "BinaryenIndex BinaryenTryAppendCatchTag(BinaryenExpressionRef, const char *)");
}

Assistant:

BinaryenIndex BinaryenTryAppendCatchTag(BinaryenExpressionRef expr,
                                        const char* catchTag) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Try>());
  assert(catchTag);
  auto& list = static_cast<Try*>(expression)->catchTags;
  auto index = list.size();
  list.push_back(catchTag);
  return index;
}